

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O1

void skiwi::inline_fl_sub(asmcode *code,compiler_options *param_2)

{
  operand local_44 [3];
  undefined8 local_38;
  
  local_44[1] = 2;
  local_44[0] = RAX;
  local_44[2] = 0x39;
  local_38 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_44 + 1,local_44,local_44 + 2,&local_38);
  local_44[1] = 2;
  local_44[0] = RBX;
  local_44[2] = 0x39;
  local_38 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_44 + 1,local_44,local_44 + 2,&local_38);
  local_38._0_4_ = MOVSD;
  local_44[1] = 0x43;
  local_44[0] = MEM_RAX;
  local_44[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38._0_4_ = MOVSD;
  local_44[1] = 0x44;
  local_44[0] = MEM_RBX;
  local_44[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38._0_4_ = SUBSD;
  local_44[1] = 0x43;
  local_44[0] = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_44 + 1,local_44);
  local_38._0_4_ = MOV;
  local_44[1] = 9;
  local_44[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_44 + 1,local_44);
  local_38._0_4_ = MOV;
  local_44[1] = 0x20;
  local_44[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_44 + 1,local_44);
  local_38._0_4_ = MOVSD;
  local_44[1] = 0x20;
  local_44[0] = DH;
  local_44[2] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_44 + 1,(int *)local_44,local_44 + 2);
  local_38._0_4_ = MOV;
  local_44[1] = 9;
  local_44[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_38,local_44 + 1,local_44);
  local_38._0_4_ = OR;
  local_44[1] = 9;
  local_44[0] = NUMBER;
  local_44[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38 = (ulong)local_38._4_4_ << 0x20;
  local_44[1] = 0x10;
  local_44[0] = NUMBER;
  local_44[2] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  return;
}

Assistant:

void inline_fl_sub(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM1, ASM::asmcode::MEM_RBX, CELLS(1));
  code.add(ASM::asmcode::SUBSD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::MEM_RAX);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::MOVSD, MEM_ALLOC, CELLS(1), ASM::asmcode::XMM0);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  }